

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sbfLogFile.c
# Opt level: O0

sbfLogFile sbfLogFile_open(char **error,char *root,char *fmt,...)

{
  char in_AL;
  int iVar1;
  char *pcVar2;
  int *piVar3;
  char *pcVar4;
  sbfLogFileEntry psVar5;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_RSI;
  sbfLogFile in_RDI;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  stat sb;
  size_t size;
  int fd;
  va_list ap;
  sbfLogFile lf;
  size_t in_stack_fffffffffffffe28;
  sbfLogFile in_stack_fffffffffffffe30;
  __va_list_tag *in_stack_fffffffffffffe38;
  char *in_stack_fffffffffffffe40;
  size_t sVar6;
  char *in_stack_fffffffffffffe48;
  sbfLogFile psVar7;
  undefined1 local_198 [24];
  undefined8 local_180;
  undefined8 local_178;
  undefined8 local_170;
  undefined8 local_168;
  undefined8 local_158;
  undefined8 local_148;
  undefined8 local_138;
  undefined8 local_128;
  stat local_e8;
  size_t local_58;
  int local_4c;
  undefined4 local_48;
  undefined4 local_44;
  undefined1 *local_40;
  undefined1 *local_38;
  sbfLogFile local_28;
  undefined8 local_20;
  undefined8 local_18;
  sbfLogFile local_10;
  
  if (in_AL != '\0') {
    local_168 = in_XMM0_Qa;
    local_158 = in_XMM1_Qa;
    local_148 = in_XMM2_Qa;
    local_138 = in_XMM3_Qa;
    local_128 = in_XMM4_Qa;
  }
  local_180 = in_RCX;
  local_178 = in_R8;
  local_170 = in_R9;
  local_20 = in_RDX;
  local_18 = in_RSI;
  local_10 = in_RDI;
  local_28 = (sbfLogFile)
             sbfMemory_calloc((size_t)in_stack_fffffffffffffe30,in_stack_fffffffffffffe28);
  local_38 = local_198;
  local_40 = &stack0x00000008;
  local_44 = 0x30;
  local_48 = 0x18;
  pcVar2 = sbfLogFileGetPath(in_stack_fffffffffffffe48,in_stack_fffffffffffffe40,
                             in_stack_fffffffffffffe38);
  local_28->mPath = pcVar2;
  local_4c = open(local_28->mPath,0x40002);
  psVar7 = local_10;
  if (local_4c == -1) {
    pcVar2 = local_28->mPath;
    piVar3 = __errno_location();
    pcVar4 = strerror(*piVar3);
    sbfMemory_asprintf(&psVar7->mPath,"open(\"%s\") failed: %s",pcVar2,pcVar4);
  }
  else {
    local_58 = sbfLogFile_size();
    iVar1 = fstat(local_4c,&local_e8);
    if (iVar1 == 0) {
      if (local_e8.st_size == local_58) {
        psVar5 = (sbfLogFileEntry)mmap((void *)0x0,local_58,1,1,local_4c,0);
        local_28->mBase = psVar5;
        if (local_28->mBase != (sbfLogFileEntry)0xffffffffffffffff) {
          local_28->mNext = 0;
          close(local_4c);
          return local_28;
        }
        pcVar2 = local_28->mPath;
        in_stack_fffffffffffffe30 = local_10;
        sVar6 = local_58;
        piVar3 = __errno_location();
        pcVar4 = strerror(*piVar3);
        sbfMemory_asprintf(&in_stack_fffffffffffffe30->mPath,"mmap(\"%s\", %zu) failed: %s",pcVar2,
                           sVar6,pcVar4);
      }
      else {
        sbfMemory_asprintf(&local_10->mPath,"%s is the wrong size (size %zu, expected %zu)",
                           local_28->mPath,local_e8.st_size,local_58);
      }
    }
    else {
      pcVar2 = local_28->mPath;
      psVar7 = local_10;
      piVar3 = __errno_location();
      pcVar4 = strerror(*piVar3);
      sbfMemory_asprintf(&psVar7->mPath,"fstat(\"%s\") failed: %s",pcVar2,pcVar4);
    }
  }
  sbfLogFile_close(in_stack_fffffffffffffe30);
  if (local_4c != -1) {
    close(local_4c);
  }
  return (sbfLogFile)0x0;
}

Assistant:

sbfLogFile
sbfLogFile_open (char** error, const char* root, const char* fmt, ...)
{
    sbfLogFile  lf;
    va_list     ap;
    int         fd;
    size_t      size;
    struct stat sb;

    lf = xcalloc (1, sizeof *lf);

    va_start (ap, fmt);
    lf->mPath = sbfLogFileGetPath (root, fmt, ap);
    va_end (ap);

    fd = open (lf->mPath, O_RDWR|O_NOATIME);
    if (fd == -1)
    {
        xasprintf (error,
                   "open(\"%s\") failed: %s",
                   lf->mPath,
                   strerror (errno));
        goto fail;
    }

    size = sbfLogFile_size ();
    if (fstat (fd, &sb) != 0)
    {
        xasprintf (error,
                   "fstat(\"%s\") failed: %s",
                   lf->mPath,
                   strerror (errno));
        goto fail;
    }
    if (sb.st_size != (off_t)size)
    {
        xasprintf (error,
                   "%s is the wrong size (size %zu, expected %zu)",
                   lf->mPath,
                   sb.st_size,
                   size);
        goto fail;
    }

    lf->mBase = mmap (NULL, size, PROT_READ, MAP_SHARED, fd, 0);
    if (lf->mBase == MAP_FAILED)
    {
        xasprintf (error,
                   "mmap(\"%s\", %zu) failed: %s",
                   lf->mPath,
                   size,
                   strerror (errno));
        goto fail;
    }
    lf->mNext = 0;

    close (fd);

    return lf;

fail:
    sbfLogFile_close (lf);

    if (fd != -1)
        close (fd);

    return NULL;
}